

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_R_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Data_Query_R_PDU::Decode(Data_Query_R_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT32 *T;
  KUINT32 *T_00;
  iterator iVar1;
  KUINT16 KVar2;
  uint uVar3;
  KException *this_00;
  int iVar4;
  undefined7 in_register_00000011;
  ushort uVar5;
  KUINT32 tmp;
  KString local_58;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_38;
  
  KVar2 = KDataStream::GetBufferSize(stream);
  iVar4 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar4 = 0;
  }
  if (0x2b < iVar4 + (uint)KVar2) {
    Simulation_Management_Header::Decode((Simulation_Management_Header *)this,stream,ignoreHeader);
    Reliability_Header::Decode(&this->super_Reliability_Header,stream);
    KDataStream::Read<unsigned_int>(stream,&(this->super_Data_Query_PDU).m_ui32RequestID);
    (*(this->super_Data_Query_PDU).m_TimeInterval.super_DataTypeBase._vptr_DataTypeBase[3])
              (&(this->super_Data_Query_PDU).m_TimeInterval,stream);
    T = &(this->super_Data_Query_PDU).m_ui32NumFixedDatum;
    KDataStream::Read<unsigned_int>(stream,T);
    T_00 = &(this->super_Data_Query_PDU).m_ui32NumVariableDatum;
    KDataStream::Read<unsigned_int>(stream,T_00);
    local_58._M_dataplus._M_p = (pointer)((ulong)local_58._M_dataplus._M_p._4_4_ << 0x20);
    if ((this->super_Data_Query_PDU).m_ui32NumFixedDatum != 0) {
      local_38 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                 &(this->super_Data_Query_PDU).m_vFixedDatum;
      uVar5 = 1;
      do {
        KDataStream::Read<unsigned_int>(stream,(uint *)&local_58);
        iVar1._M_current =
             (this->super_Data_Query_PDU).m_vFixedDatum.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->super_Data_Query_PDU).m_vFixedDatum.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(local_38,iVar1,(uint *)&local_58);
        }
        else {
          *iVar1._M_current = (uint)local_58._M_dataplus._M_p;
          (this->super_Data_Query_PDU).m_vFixedDatum.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        uVar3 = (uint)uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar3 < *T);
    }
    if (*T_00 != 0) {
      uVar5 = 1;
      do {
        KDataStream::Read<unsigned_int>(stream,(uint *)&local_58);
        iVar1._M_current =
             (this->super_Data_Query_PDU).m_vVariableDatum.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->super_Data_Query_PDU).m_vVariableDatum.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &(this->super_Data_Query_PDU).m_vVariableDatum,iVar1,(uint *)&local_58);
        }
        else {
          *iVar1._M_current = (uint)local_58._M_dataplus._M_p;
          (this->super_Data_Query_PDU).m_vVariableDatum.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        uVar3 = (uint)uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar3 < *T_00);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Decode","");
  KException::KException(this_00,&local_58,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Data_Query_R_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < DATA_QUERY_R_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Simulation_Management_Header::Decode( stream, ignoreHeader );
    Reliability_Header::Decode( stream );

    stream >> m_ui32RequestID
           >> KDIS_STREAM m_TimeInterval
           >> m_ui32NumFixedDatum
           >> m_ui32NumVariableDatum;

    KUINT32 tmp = 0;

    // FixedDatum
    for( KUINT16 i = 0; i < m_ui32NumFixedDatum; ++i )
    {
        stream >> tmp;
        m_vFixedDatum.push_back( tmp );
    }

    // VariableDatum
    for( KUINT16 i = 0; i < m_ui32NumVariableDatum; ++i )
    {
        stream >> tmp;
        m_vVariableDatum.push_back( tmp );
    }
}